

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O1

void __thiscall
QExplicitlySharedDataPointer<QCollatorSortKeyPrivate>::~QExplicitlySharedDataPointer
          (QExplicitlySharedDataPointer<QCollatorSortKeyPrivate> *this)

{
  QCollatorSortKeyPrivate *pQVar1;
  Data *pDVar2;
  
  pQVar1 = (this->d).ptr;
  if (pQVar1 != (QCollatorSortKeyPrivate *)0x0) {
    LOCK();
    (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type_conflict)
          (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if (((__int_type_conflict)
         (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int> == 0) &&
       (pQVar1 = (this->d).ptr, pQVar1 != (QCollatorSortKeyPrivate *)0x0)) {
      pDVar2 = (pQVar1->m_key).d.d;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>
             + -1);
        UNLOCK();
        if ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>
            == 0) {
          QArrayData::deallocate(&((pQVar1->m_key).d.d)->super_QArrayData,1,0x10);
        }
      }
      operator_delete(pQVar1,0x20);
      return;
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }